

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaJsonWriter::BeginArray(VmaJsonWriter *this,bool singleLine)

{
  StackItem *pSVar1;
  VmaVector<char,_VmaStlAllocator<char>_> *this_00;
  size_t sVar2;
  StackItem *pSVar3;
  
  BeginValue(this,false);
  this_00 = &this->m_SB->m_Data;
  sVar2 = this_00->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(this_00,sVar2 + 1);
  this_00->m_pArray[sVar2] = '[';
  sVar2 = (this->m_Stack).m_Count;
  VmaVector<VmaJsonWriter::StackItem,_VmaStlAllocator<VmaJsonWriter::StackItem>_>::resize
            (&this->m_Stack,sVar2 + 1);
  pSVar3 = (this->m_Stack).m_pArray;
  pSVar1 = pSVar3 + sVar2;
  pSVar1->type = COLLECTION_TYPE_ARRAY;
  pSVar1->valueCount = 0;
  pSVar3[sVar2].singleLineMode = singleLine;
  return;
}

Assistant:

void VmaJsonWriter::BeginArray(bool singleLine)
{
    VMA_ASSERT(!m_InsideString);

    BeginValue(false);
    m_SB.Add('[');

    StackItem item;
    item.type = COLLECTION_TYPE_ARRAY;
    item.valueCount = 0;
    item.singleLineMode = singleLine;
    m_Stack.push_back(item);
}